

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O0

void new_points_start_do_proc(Am_Object *inter)

{
  Am_Value *value;
  Am_Object local_28;
  undefined1 local_20 [8];
  Am_Object_Method method;
  Am_Object *inter_local;
  
  method.Call = (Am_Object_Method_Type *)inter;
  fix_feedback_for_inter(inter);
  Am_Object_Method::Am_Object_Method((Am_Object_Method *)local_20);
  value = Am_Object::Get(&Am_New_Points_Interactor,199,0);
  Am_Object_Method::operator=((Am_Object_Method *)local_20,value);
  Am_Object::Am_Object(&local_28,inter);
  (*(code *)method.from_wrapper)(&local_28);
  Am_Object::~Am_Object(&local_28);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, new_points_start_do, (Am_Object inter))
{
  fix_feedback_for_inter(inter);
  //now call the prototype's method, which we have stored as the REDO method
  Am_Object_Method method;
  method = Am_New_Points_Interactor.Get(Am_START_DO_METHOD);
  method.Call(inter);
}